

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# film.cpp
# Opt level: O1

GBufferFilm *
pbrt::GBufferFilm::Create
          (ParameterDictionary *parameters,Float exposureTime,FilterHandle *filter,
          RGBColorSpace *colorSpace,FileLoc *loc,Allocator alloc)

{
  Point2<int> *pPVar1;
  bool bVar2;
  int iVar3;
  PixelSensor *sensor;
  undefined4 extraout_var;
  bool writeFP16;
  Float maxComponentValue;
  FilmBaseParameters filmBaseParameters;
  bool local_c1;
  polymorphic_allocator<std::byte> local_c0;
  Float local_b4;
  Float local_b0;
  Float local_ac;
  RGBColorSpace *local_a8;
  FilmBaseParameters local_a0;
  string local_50;
  TaggedPointer<pbrt::BoxFilter,_pbrt::GaussianFilter,_pbrt::MitchellFilter,_pbrt::LanczosSincFilter,_pbrt::TriangleFilter>
  local_30;
  
  pPVar1 = &local_a0.pixelBounds.pMax;
  local_c0.memoryResource = alloc.memoryResource;
  local_b0 = exposureTime;
  local_a8 = colorSpace;
  local_a0.fullResolution.super_Tuple2<pbrt::Point2,_int> = (Tuple2<pbrt::Point2,_int>)pPVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"maxcomponentvalue","");
  local_ac = ParameterDictionary::GetOneFloat(parameters,(string *)&local_a0,INFINITY);
  if (local_a0.fullResolution.super_Tuple2<pbrt::Point2,_int> != (Tuple2<pbrt::Point2,_int>)pPVar1)
  {
    local_b4 = local_ac;
    operator_delete((void *)local_a0.fullResolution.super_Tuple2<pbrt::Point2,_int>,
                    (long)local_a0.pixelBounds.pMax.super_Tuple2<pbrt::Point2,_int> + 1);
    local_ac = local_b4;
  }
  local_a0.fullResolution.super_Tuple2<pbrt::Point2,_int> = (Tuple2<pbrt::Point2,_int>)pPVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"savefp16","");
  local_c1 = ParameterDictionary::GetOneBool(parameters,(string *)&local_a0,true);
  if (local_a0.fullResolution.super_Tuple2<pbrt::Point2,_int> != (Tuple2<pbrt::Point2,_int>)pPVar1)
  {
    operator_delete((void *)local_a0.fullResolution.super_Tuple2<pbrt::Point2,_int>,
                    (long)local_a0.pixelBounds.pMax.super_Tuple2<pbrt::Point2,_int> + 1);
  }
  sensor = PixelSensor::Create(parameters,local_a8,local_b0,loc,(Allocator)local_c0.memoryResource);
  local_30.bits =
       (filter->
       super_TaggedPointer<pbrt::BoxFilter,_pbrt::GaussianFilter,_pbrt::MitchellFilter,_pbrt::LanczosSincFilter,_pbrt::TriangleFilter>
       ).bits;
  FilmBaseParameters::FilmBaseParameters(&local_a0,parameters,(FilterHandle *)&local_30,sensor,loc);
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"exr","");
  bVar2 = HasExtension(&local_a0.filename,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if (bVar2) {
    iVar3 = (*(local_c0.memoryResource)->_vptr_memory_resource[2])(local_c0.memoryResource,0xa8,8);
    pstd::pmr::polymorphic_allocator<std::byte>::
    construct<pbrt::GBufferFilm,pbrt::FilmBaseParameters&,pbrt::RGBColorSpace_const*&,float&,bool&,pstd::pmr::polymorphic_allocator<std::byte>&>
              (&local_c0,(GBufferFilm *)CONCAT44(extraout_var,iVar3),&local_a0,&local_a8,&local_ac,
               &local_c1,&local_c0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0.filename._M_dataplus._M_p != &local_a0.filename.field_2) {
      operator_delete(local_a0.filename._M_dataplus._M_p,
                      local_a0.filename.field_2._M_allocated_capacity + 1);
    }
    return (GBufferFilm *)CONCAT44(extraout_var,iVar3);
  }
  ErrorExit<std::__cxx11::string&>
            (loc,"%s: EXR is the only format supported by the GBufferFilm.",&local_a0.filename);
}

Assistant:

GBufferFilm *GBufferFilm::Create(const ParameterDictionary &parameters,
                                 Float exposureTime, FilterHandle filter,
                                 const RGBColorSpace *colorSpace, const FileLoc *loc,
                                 Allocator alloc) {
    Float maxComponentValue = parameters.GetOneFloat("maxcomponentvalue", Infinity);
    bool writeFP16 = parameters.GetOneBool("savefp16", true);

    PixelSensor *sensor =
        PixelSensor::Create(parameters, colorSpace, exposureTime, loc, alloc);

    FilmBaseParameters filmBaseParameters(parameters, filter, sensor, loc);

    if (!HasExtension(filmBaseParameters.filename, "exr"))
        ErrorExit(loc, "%s: EXR is the only format supported by the GBufferFilm.",
                  filmBaseParameters.filename);

    return alloc.new_object<GBufferFilm>(filmBaseParameters, colorSpace,
                                         maxComponentValue, writeFP16, alloc);
}